

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O0

int32_t uloc_acceptLanguageCompare(void *param_1,void *a,void *b)

{
  uint local_34;
  int32_t rc;
  _acceptLangItem *bb;
  _acceptLangItem *aa;
  void *b_local;
  void *a_local;
  void *param_0_local;
  
  if (*a <= *b) {
    local_34 = (uint)(*a <= *b && *b != *a);
  }
  else {
    local_34 = 0xffffffff;
  }
  if (local_34 == 0) {
    local_34 = uprv_stricmp_63((char *)((long)a + 8),(char *)((long)b + 8));
  }
  return local_34;
}

Assistant:

static int32_t U_CALLCONV
uloc_acceptLanguageCompare(const void * /*context*/, const void *a, const void *b)
{
    const _acceptLangItem *aa = (const _acceptLangItem*)a;
    const _acceptLangItem *bb = (const _acceptLangItem*)b;

    int32_t rc = 0;
    if(bb->q < aa->q) {
        rc = -1;  /* A > B */
    } else if(bb->q > aa->q) {
        rc = 1;   /* A < B */
    } else {
        rc = 0;   /* A = B */
    }

    if(rc==0) {
        rc = uprv_stricmp(aa->locale, bb->locale);
    }

#if defined(ULOC_DEBUG)
    /*  fprintf(stderr, "a:[%s:%g], b:[%s:%g] -> %d\n",
    aa->locale, aa->q,
    bb->locale, bb->q,
    rc);*/
#endif

    return rc;
}